

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

void __thiscall
booster::aio::stream_socket::async_write(stream_socket *this,const_buffer *buffer,io_handler *h)

{
  const_buffer *__return_storage_ptr__;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> iVar1;
  atomic_counter *this_00;
  bool bVar2;
  error_category *peVar3;
  writer_all *pwVar4;
  pointer_type this_01;
  size_t n;
  writer_all *pwVar5;
  io_service *piVar6;
  error_code e_1;
  error_code e;
  error_code local_80;
  const_buffer local_70;
  error_code local_40;
  
  bVar2 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (!bVar2) {
    return;
  }
  local_40._M_value = 0;
  peVar3 = (error_category *)std::_V2::system_category();
  local_40._M_cat = peVar3;
  pwVar4 = (writer_all *)write_some(this,buffer,&local_40);
  if (local_40._M_value == 0) {
    pwVar5 = (writer_all *)
             buffer_impl<const_char_*>::bytes_count(&buffer->super_buffer_impl<const_char_*>);
    if (pwVar4 == pwVar5) goto LAB_00166b5c;
  }
  else {
    bVar2 = basic_io_device::would_block(&local_40);
    if (!bVar2) {
LAB_00166b5c:
      piVar6 = basic_io_device::get_io_service((basic_io_device *)this);
      io_service::post(piVar6,h,&local_40,(size_t)pwVar4);
      return;
    }
  }
  this_01.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x58);
  ((this_01.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cef10;
  this_00 = (atomic_counter *)((long)&(this_01.p_)->super_refcounted + 8);
  atomic_counter::atomic_counter(this_00,0);
  ((this_01.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__writer_all_001cf420;
  __return_storage_ptr__ = (const_buffer *)(this_01.p_ + 1);
  details::advance<booster::aio::const_buffer>(__return_storage_ptr__,buffer,(size_t)pwVar4);
  this_01.p_[4].super_refcounted._vptr_refcounted = (_func_int **)pwVar4;
  *(stream_socket **)((long)(this_01.p_ + 4) + 8) = this;
  pwVar4 = (writer_all *)(h->call_ptr).p_;
  this_01.p_[5].super_refcounted._vptr_refcounted = (_func_int **)pwVar4;
  if (pwVar4 != (writer_all *)0x0) {
    atomic_counter::inc(&(pwVar4->super_callable<void_(const_std::error_code_&)>).super_refcounted.
                         refs_);
  }
  atomic_counter::inc(this_00);
  local_80._M_value = 0;
  local_80._M_cat = peVar3;
  n = write_some((stream_socket *)*(writer_all **)((long)(this_01.p_ + 4) + 8),
                 __return_storage_ptr__,&local_80);
  this_01.p_[4].super_refcounted._vptr_refcounted =
       (_func_int **)
       ((long)&(((writer_all *)this_01.p_[4].super_refcounted._vptr_refcounted)->
               super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted + n
       );
  details::advance<booster::aio::const_buffer>(&local_70,__return_storage_ptr__,n);
  this_01.p_[2].super_refcounted._vptr_refcounted =
       (_func_int **)local_70.super_buffer_impl<const_char_*>.entry_.size;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ =
       local_70.super_buffer_impl<const_char_*>.size_;
  *(undefined4 *)&(__return_storage_ptr__->super_buffer_impl<const_char_*>).field_0x4 =
       local_70.super_buffer_impl<const_char_*>._4_4_;
  *(char **)((long)(this_01.p_ + 1) + 8) = local_70.super_buffer_impl<const_char_*>.entry_.ptr;
  iVar1.p_ = *(writer_all **)((long)(this_01.p_ + 2) + 8);
  *(pointer *)((long)(this_01.p_ + 2) + 8) =
       local_70.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this_01.p_[3].super_refcounted._vptr_refcounted =
       (_func_int **)
       local_70.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)(this_01.p_ + 3) + 8) =
       local_70.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((iVar1.p_ != (writer_all *)0x0) &&
     (operator_delete(iVar1.p_),
     local_70.super_buffer_impl<const_char_*>.vec_.
     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_70.super_buffer_impl<const_char_*>.vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ == 0) ||
     ((local_80._M_value != 0 && (bVar2 = basic_io_device::would_block(&local_80), !bVar2)))) {
    piVar6 = basic_io_device::get_io_service
                       ((basic_io_device *)*(writer_all **)((long)(this_01.p_ + 4) + 8));
    io_service::post(piVar6,(io_handler *)(this_01.p_ + 5),&local_80,
                     (size_t)this_01.p_[4].super_refcounted._vptr_refcounted);
  }
  else {
    iVar1.p_ = *(writer_all **)((long)(this_01.p_ + 4) + 8);
    atomic_counter::inc(this_00);
    local_70.super_buffer_impl<const_char_*>._0_8_ = this_01.p_;
    atomic_counter::inc(this_00);
    basic_io_device::on_writeable((basic_io_device *)iVar1.p_,(event_handler *)&local_70);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_70);
    intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr
              ((intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> *)this_01.p_);
  }
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr
            ((intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> *)this_01.p_);
  return;
}

Assistant:

void stream_socket::async_write(const_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;

	#ifdef BOOSTER_AIO_FORCE_POLL
	writer_all::pointer r(new writer_all(this,buffer,0,h));
	r->run();
	#else
	system::error_code e;
	size_t n = write_some(buffer,e);
	if((!e && n!=buffer.bytes_count()) || (e && would_block(e))) {
		writer_all::pointer r(new writer_all(this,buffer,n,h));
		r->run();
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif




}